

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  FilterBlockReader *this_00;
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Iterator *pIVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  code *in_R9;
  Slice handle_value;
  BlockHandle handle;
  BlockHandle local_80;
  Slice local_68;
  Slice local_50;
  undefined8 local_40 [2];
  
  this->rep_ = (Rep *)0x0;
  pIVar3 = Block::NewIterator((Block *)(*(undefined8 **)options)[0x113],
                              (Comparator *)**(undefined8 **)options);
  (*pIVar3->_vptr_Iterator[5])(pIVar3,arg);
  iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
  if ((char)iVar2 == '\0') goto LAB_0011daf9;
  iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
  local_80.size_ = CONCAT44(extraout_var,iVar2);
  this_00 = *(FilterBlockReader **)(*(long *)options + 0x878);
  local_68.data_._0_4_ = 0xffffffff;
  local_68.data_._4_4_ = 0xffffffff;
  local_68.size_._0_4_ = 0xffffffff;
  local_68.size_._4_4_ = 0xffffffff;
  if (this_00 == (FilterBlockReader *)0x0) {
LAB_0011da26:
    bVar1 = false;
  }
  else {
    BlockHandle::DecodeFrom(&local_80,&local_68);
    if ((void *)local_80.offset_ != (void *)0x0) goto LAB_0011da26;
    bVar1 = FilterBlockReader::KeyMayMatch
                      (this_00,CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_),(Slice *)arg);
    bVar1 = !bVar1;
  }
  if ((this_00 != (FilterBlockReader *)0x0) && ((void *)local_80.offset_ != (void *)0x0)) {
    operator_delete__((void *)local_80.offset_);
  }
  if (!bVar1) {
    iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
    local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
    pIVar4 = BlockReader(options,(ReadOptions *)k,&local_50);
    (*pIVar4->_vptr_Iterator[5])(pIVar4,arg);
    iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
    if ((char)iVar2 != '\0') {
      iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
      local_50.data_ = (char *)CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
      local_40[0] = CONCAT44(extraout_var_02,iVar2);
      (*in_R9)(handle_result,&local_50,local_40);
    }
    (*pIVar4->_vptr_Iterator[10])(&local_50,pIVar4);
    this->rep_ = (Rep *)local_50.data_;
    (*pIVar4->_vptr_Iterator[1])(pIVar4);
  }
LAB_0011daf9:
  if (this->rep_ == (Rep *)0x0) {
    (*pIVar3->_vptr_Iterator[10])(&local_80.size_,pIVar3);
    this->rep_ = (Rep *)local_80.size_;
  }
  (*pIVar3->_vptr_Iterator[1])(pIVar3);
  return (Status)(char *)this;
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}